

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O0

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,
          _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *fn,
          int *param,char (*param_3) [7])

{
  function<void_()> local_80;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  Function f;
  char (*param_local_1) [7];
  int *param_local;
  _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *fn_local;
  SyncExecutor *this_local;
  
  local_60._0_8_ = &param_local;
  local_60._8_8_ = param;
  local_60._16_8_ = param_3;
  f._M_invoker = (_Invoker_type)param_3;
  param_local = (int *)fn;
  fn_local = (_func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *
             )this;
  std::function<void()>::operator()
            ((function<void()> *)local_48,(anon_class_24_3_7e084ec6 *)local_60);
  std::function<void_()>::function(&local_80,(function<void_()> *)local_48);
  operator()(this,&local_80);
  std::function<void_()>::~function(&local_80);
  std::function<void_()>::~function((function<void_()> *)local_48);
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }